

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O2

void __thiscall
ProblemFireFighting::ProblemFireFighting
          (ProblemFireFighting *this,size_t nrAgents,size_t nrHouses,size_t nrFLs,double costOfMove,
          bool forcePositionRepres)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  MADPComponentDiscreteObservations *this_01;
  uint uVar1;
  undefined1 auVar2 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  size_t sVar3;
  ostream *poVar4;
  pointer puVar5;
  reference pvVar6;
  reference pvVar7;
  StateDistributionVector *this_02;
  MADPComponentDiscreteStates *this_03;
  MADPComponentDiscreteActions *this_04;
  bool bVar8;
  ulong uVar9;
  uint jointI;
  undefined7 in_register_00000081;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar13 [16];
  undefined1 extraout_var_00 [56];
  undefined1 in_XMM2 [16];
  size_t nrFLs_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_258;
  MADPComponentDiscreteStates *local_250;
  double local_248;
  string local_240;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrPos_vec;
  size_t nrPos;
  vector<double,_std::allocator<double>_> isd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s_vec;
  stringstream ss;
  ostream local_1a8 [376];
  undefined1 extraout_var [56];
  undefined1 auVar14 [64];
  
  sVar3 = CONCAT71(in_register_00000081,forcePositionRepres);
  *(undefined ***)&this->field_0x280 = &PTR__POSGInterface_005ec8d0;
  nrFLs_local = nrFLs;
  local_248 = costOfMove;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)&this->field_0x280,&PTR_PTR_005eb168);
  *(undefined8 *)&this->field_0x288 = 0x5ecab8;
  *(undefined8 *)&this->field_0x280 = 0x5ecc68;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)&this->field_0x280,&PTR_construction_vtable_232__005eb140)
  ;
  SoftPrintBriefDescription_abi_cxx11_
            ((string *)&ss,(ProblemFireFighting *)nrAgents,nrHouses,nrFLs,sVar3);
  SoftPrintDescription_abi_cxx11_(&local_240,(ProblemFireFighting *)nrAgents,nrHouses,nrFLs,sVar3);
  SoftPrintBriefDescription_abi_cxx11_
            ((string *)&nrPos_vec,(ProblemFireFighting *)nrAgents,nrHouses,nrFLs_local,sVar3);
  DecPOMDPDiscrete::DecPOMDPDiscrete
            (&this->super_DecPOMDPDiscrete,&PTR_construction_vtable_96__005eb090,(string *)&ss,
             &local_240,(string *)&nrPos_vec);
  std::__cxx11::string::~string((string *)&nrPos_vec);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&ss);
  auVar14._8_56_ = extraout_var_00;
  auVar14._0_8_ = extraout_XMM1_Qa;
  auVar13 = auVar14._0_16_;
  *(undefined8 *)
   &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
    super_MultiAgentDecisionProcess = 0x5ea8b8;
  *(undefined8 *)&this->field_0x280 = 0x5eacb8;
  *(undefined8 *)&this->field_0x288 = 0x5eaf10;
  *(undefined8 *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.field_0x200
       = 0x5eab30;
  *(size_t *)&(this->super_DecPOMDPDiscrete).field_0x220 = nrAgents;
  *(size_t *)&(this->super_DecPOMDPDiscrete).field_0x228 = nrHouses;
  this->_m_nrFireLevels = nrFLs_local;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->_m_nrPerStateFeatureVec;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258 = &this->_m_nrFLs_vec;
  MultiAgentDecisionProcessDiscrete::SetSparse((MultiAgentDecisionProcessDiscrete *)this,true);
  MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this,nrAgents);
  auVar2 = vcvtusi2sd_avx512f(auVar13,nrFLs_local);
  auVar13 = vcvtusi2sd_avx512f(auVar13,nrHouses);
  local_250 = auVar13._0_8_;
  auVar12._0_8_ = pow(auVar2._0_8_,(double)local_250);
  auVar12._8_56_ = extraout_var;
  sVar3 = vcvttsd2usi_avx512f(auVar12._0_16_);
  this->_m_nrJointFirelevels = sVar3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ss,nrHouses,&nrFLs_local,
             (allocator_type *)&local_240);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_258,&ss);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ss);
  if (local_248 <= 0.0 && !forcePositionRepres) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Not including positions");
    std::endl<char,std::char_traits<char>>(poVar4);
    this->_m_includePositions = false;
    this->_m_nrStateFeatures = nrHouses;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this_00,local_258);
    uVar10 = this->_m_nrJointFirelevels;
    this_03 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_S;
    for (uVar9 = 0; uVar9 < uVar10; uVar9 = (ulong)((Index)uVar9 + 1)) {
      IndexTools::JointToIndividualIndices
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nrPos_vec,(Index)uVar9,
                 this_00);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar4 = std::operator<<(local_1a8,"S_");
      PrintTools::SoftPrintVector<unsigned_int>
                (&local_240,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nrPos_vec);
      std::operator<<(poVar4,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::stringbuf::str();
      MADPComponentDiscreteStates::AddState(this_03,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&nrPos_vec);
    }
    MADPComponentDiscreteStates::SetUniformISD(this_03);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Including position");
    std::endl<char,std::char_traits<char>>(poVar4);
    nrPos = nrHouses + 1;
    this->_m_includePositions = true;
    this->_m_nrStateFeatures = nrHouses + nrAgents;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ss,nrHouses,&nrFLs_local,
               (allocator_type *)&local_240);
    __x = local_258;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_258,&ss);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ss);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&nrPos_vec,nrAgents,&nrPos,(allocator_type *)&ss);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this_00,__x);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,
               (const_iterator)
               (this->_m_nrPerStateFeatureVec).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )nrPos_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )nrPos_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish);
    local_248 = 4.94065645841247e-324;
    for (puVar5 = (this->_m_nrPerStateFeatureVec).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar5 < (this->_m_nrPerStateFeatureVec).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
      local_248 = (double)((long)local_248 * *puVar5);
    }
    _ss = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&isd,(size_type)local_248,(value_type_conflict3 *)&ss,(allocator_type *)&local_240);
    auVar2 = vcvtusi2sd_avx512f(in_XMM2,nrFLs_local);
    dVar11 = pow(auVar2._0_8_,(double)local_250);
    local_250 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_S;
    for (jointI = 0; (ulong)jointI < (ulong)local_248; jointI = jointI + 1) {
      IndexTools::JointToIndividualIndices
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &s_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,jointI,
                 this_00);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::operator<<(local_1a8,"S_");
      for (uVar10 = 0; uVar10 < nrHouses; uVar10 = (ulong)((int)uVar10 + 1)) {
        poVar4 = std::operator<<(local_1a8,"f");
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &s_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,uVar10);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      }
      bVar8 = true;
      for (; uVar10 < this->_m_nrStateFeatures; uVar10 = (ulong)((int)uVar10 + 1)) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &s_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                            uVar10);
        uVar1 = *pvVar6;
        std::operator<<(local_1a8,"h");
        if (uVar1 == nrHouses) {
          std::operator<<(local_1a8,"S");
        }
        else {
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          bVar8 = false;
        }
      }
      std::__cxx11::stringbuf::str();
      MADPComponentDiscreteStates::AddState(local_250,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      if (bVar8) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::at(&isd,(ulong)jointI);
        *pvVar7 = 1.0 / dVar11;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&s_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    this_02 = (StateDistributionVector *)operator_new(0x20);
    StateDistributionVector::StateDistributionVector(this_02,&isd);
    MADPComponentDiscreteStates::SetISD(local_250,(StateDistribution *)this_02);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&isd.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&nrPos_vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  MADPComponentDiscreteStates::SetInitialized
            (&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_S,true);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         field_0x200 + 0x68))(0x3ff0000000000000);
  ConstructActions(this);
  this_04 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_A;
  MADPComponentDiscreteActions::ConstructJointActions(this_04);
  MADPComponentDiscreteActions::SetInitialized(this_04,true);
  ConstructObservations(this);
  this_01 = &(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete._m_O;
  MADPComponentDiscreteObservations::ConstructJointObservations(this_01);
  MADPComponentDiscreteObservations::SetInitialized(this_01,true);
  MultiAgentDecisionProcessDiscrete::CreateNewTransitionModel
            ((MultiAgentDecisionProcessDiscrete *)this);
  FillTransitionModel(this);
  MultiAgentDecisionProcessDiscrete::CreateNewObservationModel
            ((MultiAgentDecisionProcessDiscrete *)this);
  FillObservationModel(this);
  MultiAgentDecisionProcessDiscrete::SetInitialized((MultiAgentDecisionProcessDiscrete *)this,true);
  (**(code **)(*(long *)&(this->super_DecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscrete.
                         super_MultiAgentDecisionProcess + 0x178))(this);
  FillRewardModel(this);
  DecPOMDPDiscrete::SetInitialized(&this->super_DecPOMDPDiscrete,true);
  return;
}

Assistant:

ProblemFireFighting::ProblemFireFighting(
        size_t nrAgents, size_t nrHouses, size_t nrFLs,
        double costOfMove, bool forcePositionRepres)
    :
        DecPOMDPDiscrete(
                SoftPrintBriefDescription(nrAgents, nrHouses, nrFLs),
                SoftPrintDescription(nrAgents, nrHouses, nrFLs),
                SoftPrintBriefDescription(nrAgents, nrHouses, nrFLs)
                )
        ,_m_nrAgents(nrAgents)
        ,_m_nrHouses(nrHouses)
        ,_m_nrFireLevels(nrFLs)
{
    SetSparse(true);
    SetNrAgents(nrAgents);


    double S = pow((double)nrFLs, (double)nrHouses);
    _m_nrJointFirelevels = (size_t) S;
    _m_nrFLs_vec =  vector<size_t>(nrHouses, nrFLs);

    //Create states, and ISD
    if(costOfMove > 0.0 || forcePositionRepres)
    {
        cout << "Including position"<<endl;
        _m_includePositions = true;
        //we're duplicating the generation of states as the matlab code does
        //(this is not the best thing as it generates states where one agent 
        //is in a start state and the other is not...)


        //the s_vec has the form <fl...fl_h, pos...pos_n>
        _m_nrStateFeatures = nrHouses+nrAgents;
        size_t nrPos = nrHouses+1; //include the 'start' position.

        _m_nrFLs_vec = vector<size_t>(nrHouses, nrFLs);
        vector< size_t > nrPos_vec = vector<size_t>(nrAgents, nrPos);
        _m_nrPerStateFeatureVec =  _m_nrFLs_vec;
        _m_nrPerStateFeatureVec.insert(
                _m_nrPerStateFeatureVec.end(), //insert position
                nrPos_vec.begin(),  //the stuff that is 
                nrPos_vec.end()     //appended...
                );
        if(DEBUG_PFF)
            cout << "_m_nrPerStateFeatureVec=" <<
                SoftPrintVector(_m_nrPerStateFeatureVec) << endl;
        size_t nrS=1;
        for(vector<size_t>::const_iterator it = _m_nrPerStateFeatureVec.begin();
                it < _m_nrPerStateFeatureVec.end();
                it++)
            nrS *= *it;

        vector<double> isd(nrS, 0.0);
        double nrStartStates = pow((double)nrFLs, (double)nrHouses);
        double ssprob = 1.0 / nrStartStates;

        for(Index sI = 0; sI < nrS; sI++)
        {
            vector< Index> s_vec = GetStateVector(sI);
            stringstream ss;
            ss << "S_";
            Index t1;
            for(t1 = 0; t1 < nrHouses; t1++)
                ss << "f" << s_vec.at(t1);
            bool isStartState = true;
            for(; t1 < _m_nrStateFeatures; t1++)
            {
                Index hI =  s_vec.at(t1);
                ss << "h";
                if(hI == nrHouses) //start position
                    ss << "S";
                else
                {
                    ss << hI;
                    isStartState = false;
                }
            }
            this->AddState(ss.str());
            if(isStartState)
                isd.at(sI) = ssprob;

            if(DEBUG_PFF)
            {
                cout << "added " << this->GetState(sI)->SoftPrintBrief()<<endl;
            }
        }
        StateDistributionVector *isdv=new StateDistributionVector(isd);
        this->SetISD(isdv);

    }
    else
    {
        cout << "Not including positions" << endl;
        _m_includePositions = false;
        //the s_vec has the form <fl...fl_h>
        _m_nrStateFeatures = nrHouses;        
        _m_nrPerStateFeatureVec = _m_nrFLs_vec;

        if(DEBUG_PFF)
            cout << "_m_nrPerStateFeatureVec=" <<
                SoftPrintVector(_m_nrPerStateFeatureVec) << endl;

        size_t nrS = _m_nrJointFirelevels;
        if(DEBUG_PFF)
            cout << "nrStates="<<nrS<<endl;
        for(Index sI = 0; sI < nrS; sI++)
        {
            vector< Index> s_vec = GetStateVector(sI);
            stringstream ss;
            ss << "S_" << SoftPrintVector(s_vec);
            this->AddState(ss.str());
            if(DEBUG_PFF)
            {
                cout << "added " << this->GetState(sI)->SoftPrintBrief()<<endl;
            }
        }
        SetUniformISD();
    }

    SetStatesInitialized(true);
    SetDiscount(1);
    
    // add actions:
    ConstructActions();
    if(DEBUG_CJA) cout << ">>>Creating joint actions and set..."<<endl;
    // add joint actions
    size_t testNRJA = ConstructJointActions();
    if(DEBUG_CA) cout << "testNRJA="<<testNRJA<<endl;    

    SetActionsInitialized(true);

    // add observations:
    ConstructObservations();
    size_t testNRJO = ConstructJointObservations();
    if(DEBUG_CO) cout << "testNRJO="<<testNRJO<<endl;

    SetObservationsInitialized(true);

    // add the transition model
    if(DEBUG_PFF) cout << ">>>Adding Transition model..."<<endl;
    CreateNewTransitionModel();
    FillTransitionModel();    

    // add observation model
    if(DEBUG_PFF) cout << ">>>Adding Observation model..."<<endl;
    CreateNewObservationModel();
    FillObservationModel();
    MultiAgentDecisionProcessDiscrete::SetInitialized(true);

    // add rewards
    CreateNewRewardModel();
    FillRewardModel();
    if(DEBUG_PFF)     cout << "Model created..."<<endl; 
    DecPOMDPDiscrete::SetInitialized(true);
}